

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_c97ca::TraverseInfo::TraverseInfo(TraverseInfo *this,Ref node)

{
  Type TVar1;
  undefined8 *puVar2;
  long lVar3;
  ulong uVar4;
  Value *local_28;
  Ref node_local;
  
  (this->node).inst = node.inst;
  this->scanned = false;
  (this->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28 = node.inst;
  if (node.inst == (Value *)0x0) {
    __assert_fail("node.get()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm2js.cpp"
                  ,0x4c,"(anonymous namespace)::TraverseInfo::TraverseInfo(Ref)");
  }
  TVar1 = (node.inst)->type;
  if (TVar1 == AssignName_) {
    lVar3 = cashew::Value::asAssignName();
    maybeAdd(this,*(Value **)(lVar3 + 8));
  }
  else if (TVar1 == Assign_) {
    lVar3 = cashew::Value::asAssign();
    maybeAdd(this,*(Value **)(lVar3 + 8));
    maybeAdd(this,*(Value **)(lVar3 + 0x18));
  }
  else if (TVar1 == Array) {
    if ((node.inst)->type == Array) {
      uVar4 = 0;
      do {
        if ((((local_28->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).
            usedElements <= uVar4) {
          return;
        }
        puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_28);
        maybeAdd(this,(Value *)*puVar2);
        uVar4 = uVar4 + 1;
      } while (local_28->type == Array);
    }
    __assert_fail("isArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x199,"size_t cashew::Value::size()");
  }
  return;
}

Assistant:

TraverseInfo(Ref node) : node(node) {
    assert(node.get());
    if (node->isArray()) {
      for (size_t i = 0; i < node->size(); i++) {
        maybeAdd(node[i]);
      }
    } else if (node->isAssign()) {
      auto assign = node->asAssign();
      maybeAdd(assign->target());
      maybeAdd(assign->value());
    } else if (node->isAssignName()) {
      auto assign = node->asAssignName();
      maybeAdd(assign->value());
    } else {
      // no children
    }
  }